

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O0

void __thiscall duckdb::DataChunk::Deserialize(DataChunk *this,Deserializer *deserializer)

{
  anon_class_16_2_b550b6d7 func;
  uint uVar1;
  DataChunk *in_RSI;
  DataChunk *in_RDI;
  vector<duckdb::LogicalType,_true> types;
  uint row_count;
  char *in_stack_ffffffffffffff90;
  Deserializer *in_stack_ffffffffffffffa0;
  char *tag;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  field_id_t field_id;
  Deserializer *in_stack_ffffffffffffffb8;
  anon_class_8_1_a8b54799 in_stack_ffffffffffffffc0;
  char local_30 [8];
  idx_t in_stack_ffffffffffffffd8;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30);
  uVar1 = Deserializer::ReadProperty<unsigned_int>
                    (in_stack_ffffffffffffffa0,(field_id_t)((ulong)in_RDI >> 0x30),
                     in_stack_ffffffffffffff90);
  tag = local_30;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x2ba7331);
  Deserializer::
  ReadList<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_common_types_data_chunk_cpp:281:38)>
            (in_stack_ffffffffffffffb8,field_id,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffc0)
  ;
  Allocator::DefaultAllocator();
  MaxValue<unsigned_long>((ulong)uVar1,0x800);
  Initialize(in_RSI,(Allocator *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0
             ,in_stack_ffffffffffffffd8);
  SetCardinality(in_RDI,(ulong)uVar1);
  func.row_count = (uint *)in_stack_ffffffffffffffc0.types;
  func.this = (DataChunk *)in_stack_ffffffffffffffb8;
  Deserializer::
  ReadList<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_common_types_data_chunk_cpp:292:40)>
            ((Deserializer *)&stack0xffffffffffffffec,(field_id_t)((ulong)in_RDI >> 0x30),tag,func);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2ba73e6);
  return;
}

Assistant:

void DataChunk::Deserialize(Deserializer &deserializer) {

	// read and set the row count
	auto row_count = deserializer.ReadProperty<sel_t>(100, "rows");

	// read the types
	vector<LogicalType> types;
	deserializer.ReadList(101, "types", [&](Deserializer::List &list, idx_t i) {
		auto type = list.ReadElement<LogicalType>();
		types.push_back(type);
	});

	// initialize the data chunk
	D_ASSERT(!types.empty());
	Initialize(Allocator::DefaultAllocator(), types, MaxValue<idx_t>(row_count, STANDARD_VECTOR_SIZE));
	SetCardinality(row_count);

	// read the data
	deserializer.ReadList(102, "columns", [&](Deserializer::List &list, idx_t i) {
		list.ReadObject([&](Deserializer &object) { data[i].Deserialize(object, row_count); });
	});
}